

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O0

int32 align_start_utt(char *uttid)

{
  long lVar1;
  slink_s *local_18;
  slink_t *l;
  char *uttid_local;
  
  curfrm = 0;
  shead.score = 0;
  shead.hist = (history_t *)0x0;
  hist_head = (history_t *)0x0;
  n_active = 0;
  local_18 = shead.succlist;
  while( true ) {
    if (local_18 == (slink_s *)0x0) {
      lVar1 = (long)n_active;
      n_active = n_active + 1;
      cur_active[lVar1] = (snode_t *)0x0;
      return 0;
    }
    if (-1 < local_18->node->active_frm) break;
    local_18->node->active_frm = 0;
    lVar1 = (long)n_active;
    n_active = n_active + 1;
    cur_active[lVar1] = local_18->node;
    local_18 = local_18->next;
  }
  __assert_fail("l->node->active_frm < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                ,0x40d,"int32 align_start_utt(char *)");
}

Assistant:

int32
align_start_utt(char *uttid)
{
    slink_t *l;

    curfrm = 0;
    shead.score = 0;
    shead.hist = NULL;
    hist_head = NULL;

    n_active = 0;
    for (l = shead.succlist; l; l = l->next) {
        assert(l->node->active_frm < 0);
        l->node->active_frm = 0;
        cur_active[n_active++] = l->node;
    }
    cur_active[n_active++] = NULL;

    return 0;
}